

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O1

Ref<anurbs::NurbsCurveGeometry<3L>_> __thiscall
anurbs::Model::get_lazy<anurbs::NurbsCurveGeometry<3l>>(Model *this,string *key)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_type sVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator iVar5;
  long lVar6;
  mapped_type *pmVar7;
  Entry<anurbs::NurbsCurveGeometry<3L>_> *__tmp;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  bool bVar9;
  Ref<anurbs::NurbsCurveGeometry<3L>_> RVar10;
  Pointer<Entry<NurbsCurveGeometry<3L>_>_> entry;
  _Head_base<0UL,_anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_*,_false> local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  undefined1 local_78 [16];
  string local_68;
  shared_ptr<anurbs::NurbsCurveGeometry<3L>_> local_48;
  
  local_88._M_head_impl = (Entry<anurbs::NurbsCurveGeometry<3L>_> *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&key[1].field_2,in_RDX);
  this_00 = p_Stack_80;
  pcVar1 = (key->_M_dataplus)._M_p;
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    sVar3 = key->_M_string_length;
    local_68._M_dataplus._M_p = local_78 + 0x20;
    pcVar4 = (in_RDX->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_78 + 0x10),pcVar4,pcVar4 + in_RDX->_M_string_length);
    local_48.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Entry<anurbs::NurbsCurveGeometry<3L>_>::create
              ((Entry<anurbs::NurbsCurveGeometry<3L>_> *)local_78,(string *)(local_78 + 0x10),
               (shared_ptr<anurbs::NurbsCurveGeometry<3L>_> *)(local_78 + 0x30));
    std::__shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>,(__gnu_cxx::_Lock_policy)2>::
    operator=((__shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3l>>,(__gnu_cxx::_Lock_policy)2>
               *)&local_88,
              (unique_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>_>
               *)local_78);
    if ((__uniq_ptr_impl<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>_>
         )local_78._0_8_ !=
        (__uniq_ptr_impl<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>_>
         )0x0) {
      (**(code **)(*(_func_int **)local_78._0_8_ + 0x20))();
    }
    local_78._0_8_ =
         (__uniq_ptr_impl<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_std::default_delete<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>_>_>
          )0x0;
    if ((element_type *)
        local_48.super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<anurbs::NurbsCurveGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68._M_dataplus._M_p != local_78 + 0x20) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._0_8_ + 1);
    }
    local_78._0_8_ = local_88._M_head_impl;
    local_78._8_8_ = p_Stack_80;
    if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,std::allocator<std::shared_ptr<anurbs::EntryBase>>>::
    emplace_back<std::shared_ptr<anurbs::EntryBase>>
              ((vector<std::shared_ptr<anurbs::EntryBase>,std::allocator<std::shared_ptr<anurbs::EntryBase>>>
                *)key,(shared_ptr<anurbs::EntryBase> *)local_78);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
    }
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)key[1].field_2._M_local_buf,in_RDX);
    pmVar7->first = (long)(sVar3 - (long)pcVar1) >> 4;
    pmVar7->second = 0;
    _Var8._M_pi = extraout_RDX_01;
  }
  else {
    lVar6 = *(long *)((long)iVar5.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_true>
                            ._M_cur + 0x28) * 0x10;
    local_88._M_head_impl = *(Entry<anurbs::NurbsCurveGeometry<3L>_> **)(pcVar1 + lVar6);
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar1 + lVar6 + 8);
    _Var8._M_pi = extraout_RDX;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    bVar9 = p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_80 = p_Var2;
    if (bVar9) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      _Var8._M_pi = extraout_RDX_00;
    }
  }
  if (p_Stack_80 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._M_head_impl;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
    }
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._M_head_impl;
    (this->m_entries).
    super__Vector_base<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_80;
    if (p_Stack_80 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00262392;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_80->_M_use_count = p_Stack_80->_M_use_count + 1;
    }
  }
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
    _Var8._M_pi = extraout_RDX_02;
  }
LAB_00262392:
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
    _Var8._M_pi = extraout_RDX_03;
  }
  RVar10.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  RVar10.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::NurbsCurveGeometry<3L>_>)
         RVar10.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::NurbsCurveGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Ref<TData> get_lazy(std::string key)
    {
        Pointer<Entry<TData>> entry;

        const auto it = m_key_map.find(key);

        if (it == m_key_map.end()) {
            const auto index = m_entries.size();
            entry = Entry<TData>::create(key, nullptr);
            m_entries.push_back(std::static_pointer_cast<EntryBase>(entry));
            m_key_map[key] = { index, 0 };
        } else {
            entry = std::static_pointer_cast<Entry<TData>>(
                m_entries[std::get<0>(it->second)]);
        }

        return Ref<TData>(entry);
    }